

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

bool gl4cts::CopyImage::compareR11FG11FB10F(void *ptr1,void *ptr2,int num)

{
  int local_60;
  int j;
  int local_54;
  float local_50;
  int i;
  float value2 [3];
  float value1 [3];
  r11fg11fb10f *data2;
  r11fg11fb10f *data1;
  int num_local;
  void *ptr2_local;
  void *ptr1_local;
  
  local_54 = 0;
  do {
    if (num >> 2 <= local_54) {
      return true;
    }
    r11fg11fb10f_to_float3(*(r11fg11fb10f *)((long)ptr1 + (long)local_54 * 4),value2 + 1);
    r11fg11fb10f_to_float3(*(r11fg11fb10f *)((long)ptr2 + (long)local_54 * 4),&local_50);
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      if ((value2[(long)local_60 + 1] != (&local_50)[local_60]) ||
         (NAN(value2[(long)local_60 + 1]) || NAN((&local_50)[local_60]))) {
        return false;
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

bool compareR11FG11FB10F(const void* ptr1, const void* ptr2, int num)
{
	r11fg11fb10f* data1 = (r11fg11fb10f*)ptr1;
	r11fg11fb10f* data2 = (r11fg11fb10f*)ptr2;

	float value1[3];
	float value2[3];

	for (int i = 0; i<num>> 2; ++i)
	{
		r11fg11fb10f_to_float3(data1[i], value1);
		r11fg11fb10f_to_float3(data2[i], value2);

		for (int j = 0; j < 3; ++j)
		{
			if (value1[j] != value2[j])
			{
				return false;
			}
		}
	}
	return true;
}